

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

boolean_format_info * __thiscall
toml::basic_value<toml::type_config>::as_boolean_fmt(basic_value<toml::type_config> *this)

{
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == boolean) {
    return (boolean_format_info *)((long)&this->field_1 + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"toml::value::as_boolean_fmt()",&local_31);
  throw_bad_cast(this,&local_30,boolean);
}

Assistant:

boolean_format_info const& as_boolean_fmt() const
    {
        if(this->type_ != value_t::boolean)
        {
            this->throw_bad_cast("toml::value::as_boolean_fmt()", value_t::boolean);
        }
        return this->boolean_.format;
    }